

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O3

void deqp::egl::anon_unknown_0::clearColorReference(Surface *ref,Vec4 *clearColor)

{
  void *data;
  TextureFormat local_40;
  PixelBufferAccess local_38;
  
  local_40.order = RGBA;
  local_40.type = UNORM_INT8;
  data = (void *)(ref->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (ref->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_38,&local_40,ref->m_width,ref->m_height,1,data);
  tcu::clear(&local_38,clearColor);
  return;
}

Assistant:

void clearColorReference (tcu::Surface* ref, const tcu::Vec4& clearColor)
{
	tcu::clear(ref->getAccess(), clearColor);
}